

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O2

bool __thiscall
despot::option::PrintUsageImplementation::LinePartIterator::nextTable(LinePartIterator *this)

{
  char *pcVar1;
  Descriptor *pDVar2;
  
  pDVar2 = this->tablestart;
  if (this->rowdesc != (Descriptor *)0x0) {
    while ((pDVar2->help != (char *)0x0 && (pDVar2->shortopt != (char *)0x0))) {
      this->tablestart = pDVar2 + 1;
      pDVar2 = pDVar2 + 1;
    }
  }
  while( true ) {
    pcVar1 = pDVar2->help;
    if ((pcVar1 != (char *)0x0) || (pDVar2->shortopt == (char *)0x0)) break;
    this->tablestart = pDVar2 + 1;
    pDVar2 = pDVar2 + 1;
  }
  this->rowdesc = pDVar2;
  this->rowstart = pcVar1;
  this->ptr = (char *)0x0;
  return pcVar1 != (char *)0x0;
}

Assistant:

bool nextTable() {
			// If this is NOT the first time nextTable() is called after the constructor,
			// then skip to the next table break (i.e. a Descriptor with help == 0)
			if (rowdesc != 0) {
				while (tablestart->help != 0 && tablestart->shortopt != 0)
					++tablestart;
			}

			// Find the next table after the break (if any)
			while (tablestart->help == 0 && tablestart->shortopt != 0)
				++tablestart;

			restartTable();
			return rowstart != 0;
		}